

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O0

ggml_status ggml_backend_view_init(ggml_tensor *tensor)

{
  ggml_status gVar1;
  ggml_backend_buffer_t in_RDI;
  
  if ((in_RDI->iface).get_base != (_func_void_ptr_ggml_backend_buffer_t *)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-backend.cpp"
               ,0x66f,"GGML_ASSERT(%s) failed","tensor->buffer == NULL");
  }
  if (in_RDI[2].iface.memset_tensor ==
      (_func_void_ggml_backend_buffer_t_ggml_tensor_ptr_uint8_t_size_t_size_t *)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-backend.cpp"
               ,0x670,"GGML_ASSERT(%s) failed","tensor->view_src != NULL");
  }
  if (*(long *)(in_RDI[2].iface.memset_tensor + 8) == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-backend.cpp"
               ,0x671,"GGML_ASSERT(%s) failed","tensor->view_src->buffer != NULL");
  }
  if (*(long *)(in_RDI[2].iface.memset_tensor + 0xf8) == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-backend.cpp"
               ,0x672,"GGML_ASSERT(%s) failed","tensor->view_src->data != NULL");
  }
  (in_RDI->iface).get_base =
       *(_func_void_ptr_ggml_backend_buffer_t **)(in_RDI[2].iface.memset_tensor + 8);
  in_RDI[2].iface.get_tensor =
       in_RDI[2].iface.set_tensor + *(long *)(in_RDI[2].iface.memset_tensor + 0xf8);
  gVar1 = ggml_backend_buffer_init_tensor(in_RDI,(ggml_tensor *)0x162dc9);
  return gVar1;
}

Assistant:

enum ggml_status ggml_backend_view_init(struct ggml_tensor * tensor) {
    GGML_ASSERT(tensor->buffer == NULL);
    GGML_ASSERT(tensor->view_src != NULL);
    GGML_ASSERT(tensor->view_src->buffer != NULL);
    GGML_ASSERT(tensor->view_src->data != NULL);

    tensor->buffer = tensor->view_src->buffer;
    tensor->data = (char *)tensor->view_src->data + tensor->view_offs;
    return ggml_backend_buffer_init_tensor(tensor->buffer, tensor);
}